

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cc
# Opt level: O2

void __thiscall muduo::ThreadPool::run(ThreadPool *this,Task *task)

{
  bool bVar1;
  Task *__stat_loc;
  MutexLockGuard lock;
  MutexLockGuard local_20;
  
  if ((this->threads_).
      super__Vector_base<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->threads_).
      super__Vector_base<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_20.mutex_ = &this->mutex_;
    __stat_loc = task;
    MutexLock::lock(local_20.mutex_);
    while( true ) {
      bVar1 = isFull(this);
      if (!bVar1) break;
      Condition::wait(&this->notFull_,__stat_loc);
    }
    std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<std::function<void()>>
              ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)&this->queue_,
               task);
    pthread_cond_signal((pthread_cond_t *)&(this->notEmpty_).pcond_);
    MutexLockGuard::~MutexLockGuard(&local_20);
    return;
  }
  std::function<void_()>::operator()(task);
  return;
}

Assistant:

void ThreadPool::run(Task task)
{
  if (threads_.empty())
  {
    task();
  }
  else
  {
    MutexLockGuard lock(mutex_);
    while (isFull())
    {
      notFull_.wait();
    }
    assert(!isFull());

    queue_.push_back(std::move(task));
    notEmpty_.notify();
  }
}